

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O0

fvar<double,_2UL> *
ising::free_energy::square::
finite<unsigned_int,double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (uint Lx,uint Ly,double Jx,double Jy,fvar<double,_2UL> beta)

{
  bool bVar1;
  invalid_argument *piVar2;
  uint in_EDX;
  uint in_ESI;
  fvar<double,_2UL> *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> logZ;
  fvar<double,_2UL> gamma;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> cosh_g;
  int_t k;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> gamma0;
  value_t lp3;
  value_t lp2;
  value_t lp1;
  value_t lp0;
  fvar<double,_2UL> b;
  fvar<double,_2UL> a;
  real_t pi;
  fvar<double,_2UL> *in_stack_fffffffffffff298;
  fvar<double,_2UL> *in_stack_fffffffffffff2a0;
  fvar<double,_2UL> *in_stack_fffffffffffff2a8;
  fvar<double,_2UL> *in_stack_fffffffffffff2b0;
  fvar<double,_2UL> *in_stack_fffffffffffff2c0;
  fvar<double,_2UL> *in_stack_fffffffffffff2c8;
  fvar<double,_2UL> *pfVar4;
  fvar<double,_2UL> *in_stack_fffffffffffff2d0;
  fvar<double,_2UL> *pfVar5;
  fvar<double,_2UL> *in_stack_fffffffffffff2d8;
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> *in_stack_fffffffffffff2e0;
  fvar<double,_2UL> *in_stack_fffffffffffff2f0;
  fvar<double,_2UL> *in_stack_fffffffffffff2f8;
  fvar<double,_2UL> *in_stack_fffffffffffff300;
  fvar<double,_2UL> *in_stack_fffffffffffff310;
  fvar<double,_2UL> *in_stack_fffffffffffff318;
  fvar<double,_2UL> *in_stack_fffffffffffff320;
  fvar<double,_2UL> local_b28;
  fvar<double,_2UL> local_b10 [2];
  undefined8 local_ae0;
  fvar<double,_2UL> local_ac0;
  fvar<double,_2UL> local_aa8 [3];
  double local_a60;
  fvar<double,_2UL> local_a40;
  fvar<double,_2UL> local_a28 [2];
  fvar<double,_2UL> local_9f8 [2];
  undefined8 local_9c8;
  fvar<double,_2UL> local_990 [4];
  undefined8 local_930;
  double local_928;
  undefined8 local_890;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined8 local_7b8;
  undefined8 local_780;
  double local_760;
  double local_728;
  undefined8 local_6d8;
  undefined8 local_6a0;
  double local_698;
  double local_648;
  undefined8 local_5f8;
  undefined8 local_5c0;
  double local_5b8;
  double local_568;
  undefined8 local_518;
  undefined8 local_4e0;
  double local_4d8;
  double local_488;
  undefined8 local_438;
  undefined8 local_400;
  double local_3f8;
  undefined8 local_3a8;
  undefined8 local_328;
  undefined8 local_2f0;
  double local_2b8;
  undefined8 local_298;
  undefined8 local_260;
  uint local_1dc;
  undefined8 local_1d8;
  undefined8 local_1b8;
  undefined8 local_180;
  undefined8 local_148;
  int local_dc;
  fvar<double,_2UL> local_d8;
  int local_bc;
  fvar<double,_2UL> local_b8;
  int local_9c;
  fvar<double,_2UL> local_98;
  int local_7c;
  fvar<double,_2UL> local_78 [3];
  type local_30;
  uint local_8;
  uint local_4;
  
  if ((in_ESI == 0) || (in_EDX == 0)) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Lx and Ly should be positive");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((0.0 < in_XMM0_Qa) && (0.0 < (double)CONCAT44(in_XMM1_Db,in_XMM1_Da))) {
    local_8 = in_EDX;
    local_4 = in_ESI;
    local_30 = boost::math::constants::pi<double>();
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*
              (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*
              (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
    local_7c = 0;
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::fvar<int>
              (local_78,&local_7c);
    local_9c = 0;
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::fvar<int>
              (&local_98,&local_9c);
    local_bc = 0;
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::fvar<int>
              (&local_b8,&local_bc);
    local_dc = 0;
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::fvar<int>
              (&local_d8,&local_dc);
    local_148 = 0x3ff0000000000000;
    local_180 = 0x4000000000000000;
    boost::math::differentiation::autodiff_v1::detail::operator*
              ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
    boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>(in_stack_fffffffffffff2d0);
    boost::math::differentiation::autodiff_v1::detail::operator+
              ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
    local_1b8 = 0x4000000000000000;
    boost::math::differentiation::autodiff_v1::detail::operator*
              ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
    boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>(in_stack_fffffffffffff2d0);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
              (in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    boost::math::differentiation::autodiff_v1::detail::log<double,2ul>(in_stack_fffffffffffff2f0);
    local_1d8 = 0x4000000000000000;
    boost::math::differentiation::autodiff_v1::detail::operator*
              ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
              (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
    for (local_1dc = 0; local_1dc < local_8 << 1; local_1dc = local_1dc + 1) {
      local_260 = 0x4000000000000000;
      boost::math::differentiation::autodiff_v1::detail::operator*
                ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
      boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>(in_stack_fffffffffffff2d0)
      ;
      local_298 = 0x4000000000000000;
      boost::math::differentiation::autodiff_v1::detail::operator*
                ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
      boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>(in_stack_fffffffffffff2d0)
      ;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
                (in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
      local_2b8 = cos((local_30 * (double)local_1dc) / (double)local_8);
      local_2f0 = 0x4000000000000000;
      boost::math::differentiation::autodiff_v1::detail::operator*
                ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
      boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>(in_stack_fffffffffffff2d0)
      ;
      boost::math::differentiation::autodiff_v1::detail::operator*
                ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      local_328 = 0x4000000000000000;
      boost::math::differentiation::autodiff_v1::detail::operator*
                ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
      boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>(in_stack_fffffffffffff2d0)
      ;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
                (in_stack_fffffffffffff320,in_stack_fffffffffffff318);
      if (local_1dc == 0) {
        boost::math::differentiation::autodiff_v1::detail::abs<double,2ul>
                  (in_stack_fffffffffffff2a0);
      }
      else {
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
                  (in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
        local_3a8 = 0x3ff0000000000000;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator-
                  (in_stack_fffffffffffff2b0,(root_type *)in_stack_fffffffffffff2a8);
        boost::math::differentiation::autodiff_v1::detail::sqrt<double,2ul>
                  (in_stack_fffffffffffff310);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                  (in_stack_fffffffffffff2f0);
      }
      if ((local_1dc & 1) == 1) {
        local_3f8 = (double)local_4;
        boost::math::differentiation::autodiff_v1::detail::operator*
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        local_400 = 0x4000000000000000;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/
                  (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
        local_438 = 0x3ff0000000000000;
        local_488 = (double)local_4;
        boost::math::differentiation::autodiff_v1::detail::operator*
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator-
                  (in_stack_fffffffffffff2a0);
        boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                  (in_stack_fffffffffffff2c0);
        boost::math::differentiation::autodiff_v1::detail::operator+
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                  (in_stack_fffffffffffff2f0);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
        local_4d8 = (double)local_4;
        boost::math::differentiation::autodiff_v1::detail::operator*
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        local_4e0 = 0x4000000000000000;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/
                  (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
        local_518 = 0x3ff0000000000000;
        local_568 = (double)local_4;
        boost::math::differentiation::autodiff_v1::detail::operator*
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator-
                  (in_stack_fffffffffffff2a0);
        boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                  (in_stack_fffffffffffff2c0);
        boost::math::differentiation::autodiff_v1::detail::operator-
                  ((root_type *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
        boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                  (in_stack_fffffffffffff2f0);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
      }
      else {
        local_5b8 = (double)local_4;
        boost::math::differentiation::autodiff_v1::detail::operator*
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        local_5c0 = 0x4000000000000000;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/
                  (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
        local_5f8 = 0x3ff0000000000000;
        local_648 = (double)local_4;
        boost::math::differentiation::autodiff_v1::detail::operator*
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator-
                  (in_stack_fffffffffffff2a0);
        boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                  (in_stack_fffffffffffff2c0);
        boost::math::differentiation::autodiff_v1::detail::operator+
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                  (in_stack_fffffffffffff2f0);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
        local_698 = (double)local_4;
        boost::math::differentiation::autodiff_v1::detail::operator*
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        local_6a0 = 0x4000000000000000;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/
                  (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
        local_6d8 = 0x3ff0000000000000;
        local_728 = (double)local_4;
        boost::math::differentiation::autodiff_v1::detail::operator*
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator-
                  (in_stack_fffffffffffff2a0);
        boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                  (in_stack_fffffffffffff2c0);
        boost::math::differentiation::autodiff_v1::detail::operator-
                  ((root_type *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
        boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                  (in_stack_fffffffffffff2f0);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
      }
    }
    dVar3 = log(2.0);
    local_760 = -dVar3 / (double)(local_4 * local_8);
    boost::math::differentiation::autodiff_v1::detail::operator+
              ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
    local_780 = 0x3fe0000000000000;
    local_7b8 = 0x3ff0000000000000;
    local_7f0 = 0xc010000000000000;
    boost::math::differentiation::autodiff_v1::detail::operator*
              ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
    boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(in_stack_fffffffffffff2c0);
    boost::math::differentiation::autodiff_v1::detail::operator-
              ((root_type *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
    boost::math::differentiation::autodiff_v1::detail::log<double,2ul>(in_stack_fffffffffffff2f0);
    boost::math::differentiation::autodiff_v1::detail::operator*
              ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
              (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
    local_7f8 = 0;
    bVar1 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator>
                      (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
    if (bVar1) {
      local_890 = 0x3ff0000000000000;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(in_stack_fffffffffffff2c0);
      boost::math::differentiation::autodiff_v1::detail::operator+
                ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(in_stack_fffffffffffff2c0);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(in_stack_fffffffffffff2c0);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>(in_stack_fffffffffffff2f0);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      local_928 = (double)(local_4 * local_8);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/
                (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
    }
    else {
      local_930 = 0;
      bVar1 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator<
                        (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
      if (bVar1) {
        local_9c8 = 0x3ff0000000000000;
        pfVar5 = local_9f8;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                  (pfVar5,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                  (in_stack_fffffffffffff2c0);
        boost::math::differentiation::autodiff_v1::detail::operator+
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        pfVar4 = local_a28;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                  (pfVar5,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                  (in_stack_fffffffffffff2c0);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (pfVar5,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                  (pfVar5,in_stack_fffffffffffff2d8);
        in_stack_fffffffffffff318 = &local_a40;
        boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                  (in_stack_fffffffffffff2c0);
        in_stack_fffffffffffff320 = local_990;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (pfVar5,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::log<double,2ul>(pfVar4);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (pfVar5,in_stack_fffffffffffff2d8);
        local_a60 = (double)(local_4 * local_8);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/
                  (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
      }
      else {
        local_ae0 = 0x3ff0000000000000;
        in_stack_fffffffffffff2a0 = local_b10;
        pfVar5 = local_78;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                  (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                  (in_stack_fffffffffffff2c0);
        boost::math::differentiation::autodiff_v1::detail::operator+
                  ((root_type *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                  (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(&local_b28);
        pfVar4 = &local_ac0;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        cr = local_aa8;
        boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                  (in_stack_fffffffffffff2f0);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (in_stack_fffffffffffff2e0,cr);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/
                  (in_stack_fffffffffffff2a0,(root_type *)in_stack_fffffffffffff298);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  (pfVar5,pfVar4);
      }
    }
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator-
              (in_stack_fffffffffffff2a0);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
              (in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    return in_RDI;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"Jx and Jy should be positive");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U finite(I Lx, I Ly, T Jx, T Jy, U beta) {
  typedef I int_t;
  typedef T real_t;
  typedef U value_t;
  if (Lx <= 0 || Ly <= 0)
    throw(std::invalid_argument("Lx and Ly should be positive"));
  if (Jx <= 0 || Jy <= 0)
    throw(std::invalid_argument("Jx and Jy should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  auto a = beta * Jx;
  auto b = beta * Jy;
  value_t lp0(0), lp1(0), lp2(0), lp3(0);
  auto gamma0 = log((1 + cosh(2 * a)) / sinh(2 * a)) - 2 * b;
  for (int_t k = 0; k < 2 * Ly; ++k) {
    auto cosh_g = (cosh(2 * a) * cosh(2 * b) - cos(pi * k / Ly) * sinh(2 * b)) /
                  sinh(2 * a);
    auto gamma =
        (k == 0) ? abs(gamma0) : (log(cosh_g + sqrt(cosh_g * cosh_g - 1)));
    if ((k & 1) == 1) {
      lp0 += (Lx * gamma / 2) + log(1 + exp(-(Lx * gamma)));
      lp1 += (Lx * gamma / 2) + log(1 - exp(-(Lx * gamma)));
    } else {
      lp2 += (Lx * gamma / 2) + log(1 + exp(-(Lx * gamma)));
      lp3 += (Lx * gamma / 2) + log(1 - exp(-(Lx * gamma)));
    }
  }
  auto logZ =
      -log(real_t(2)) / (Lx * Ly) + a + real_t(1) / 2 * log(1 - exp(-4 * a));
  if (gamma0 > 0) {
    logZ += (lp0 + log(1 + exp(lp1 - lp0) + exp(lp2 - lp0) - exp(lp3 - lp0))) /
            (Lx * Ly);
  } else if (gamma0 < 0) {
    logZ += (lp0 + log(1 + exp(lp1 - lp0) + exp(lp2 - lp0) + exp(lp3 - lp0))) /
            (Lx * Ly);
  } else {
    logZ += (lp0 + log(1 + exp(lp1 - lp0) + exp(lp2 - lp0))) / (Lx * Ly);
  }
  return -logZ / beta;
}